

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax
          (UnarySelectPropertyExprSyntax *syntax,ASTContext *context)

{
  Scope *pSVar1;
  Compilation *this;
  SelectorSyntax *syntax_00;
  AssertionExpr *this_00;
  UnaryAssertionOperator UVar2;
  int iVar3;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar4;
  char *func;
  bitmask<slang::ast::ASTFlags> addedFlags;
  bool bVar5;
  SequenceRange SVar6;
  UnaryAssertionOperator op;
  UnaryAssertionOperator local_6c;
  _Storage<slang::ast::SequenceRange,_true> local_68;
  bool local_5c;
  ASTContext local_58;
  
  pSVar1 = (context->scope).ptr;
  if (pSVar1 == (Scope *)0x0) {
    func = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
  }
  else {
    this = pSVar1->compilation;
    UVar2 = getUnaryOp((syntax->op).kind);
    local_5c = false;
    syntax_00 = syntax->selector;
    local_6c = UVar2;
    if (syntax_00 == (SelectorSyntax *)0x0) {
      bVar5 = false;
    }
    else {
      SVar6 = SequenceRange::fromSyntax(syntax_00,context,UVar2 == SEventually || UVar2 == Always);
      local_68._0_8_ = SVar6._0_8_;
      local_68._M_value.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged =
           (bool)SVar6.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_engaged;
      bVar5 = SVar6.min != 0;
    }
    local_5c = syntax_00 != (SelectorSyntax *)0x0;
    if (((Eventually < UVar2) || ((0x2aU >> (UVar2 & 0x1f) & 1) == 0)) ||
       (addedFlags.m_bits = 0x1000000, !bVar5)) {
      addedFlags.m_bits = (underlying_type)((~UVar2 & 1) << 0x17);
    }
    this_00 = (AssertionExpr *)(syntax->expr).ptr;
    if (this_00 != (AssertionExpr *)0x0) {
      ASTContext::resetFlags(&local_58,context,addedFlags);
      iVar3 = AssertionExpr::bind(this_00,(int)&local_58,(sockaddr *)0x0,0);
      pUVar4 = BumpAllocator::
               emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
                         (&this->super_BumpAllocator,&local_6c,
                          (AssertionExpr *)CONCAT44(extraout_var,iVar3),
                          (optional<slang::ast::SequenceRange> *)&local_68._M_value);
      return &pUVar4->super_AssertionExpr;
    }
    func = 
    "T slang::not_null<slang::syntax::PropertyExprSyntax *>::get() const [T = slang::syntax::PropertyExprSyntax *]"
    ;
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

bool visitInvalid(const AssertionExpr&) { return false; }